

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlReportText.cpp
# Opt level: O2

string * __thiscall
oout::FmtJunitXml::test
          (string *__return_storage_ptr__,FmtJunitXml *this,string *name,
          shared_ptr<const_oout::Result> *assertion_result,nanoseconds *duration)

{
  long lVar1;
  element_type *peVar2;
  ostream *poVar3;
  ostringstream out;
  string local_1c0 [32];
  ostringstream local_1a0 [376];
  
  lVar1 = duration->__r;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar3 = std::operator<<((ostream *)local_1a0,"<testcase ");
  poVar3 = std::operator<<(poVar3,"name=\'");
  poVar3 = std::operator<<(poVar3,(string *)name);
  poVar3 = std::operator<<(poVar3,"\' ");
  poVar3 = std::operator<<(poVar3,"time=\'");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(float)lVar1 / 1e+09);
  poVar3 = std::operator<<(poVar3,"\'>");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  peVar2 = (assertion_result->super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  (*peVar2->_vptr_Result[2])(local_1c0,peVar2,this);
  poVar3 = std::operator<<(poVar3,local_1c0);
  poVar3 = std::operator<<(poVar3,"</testcase>");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string test(
		const string &name,
		const shared_ptr<const Result> &assertion_result,
		const chrono::nanoseconds &duration
	) const override
	{
		const auto time = chrono::duration_cast<chrono::duration<float>>(duration).count();
		ostringstream out;
		out << "<testcase "
		    << "name='" << name << "' "
		    << "time='" << time << "'>" << endl
		    << assertion_result->print(*this)
		    << "</testcase>" << endl;
		return out.str();
	}